

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O3

bool ON_WildCardMatchNoCase(wchar_t *s,wchar_t *pattern)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  bool bVar3;
  wchar_t __wc;
  wint_t wVar4;
  wint_t wVar5;
  
  if (pattern == (wchar_t *)0x0) {
LAB_0067279b:
    if (s == (wchar_t *)0x0) {
LAB_006727b9:
      bVar3 = true;
    }
    else {
      bVar3 = *s == L'\0';
    }
  }
  else {
    __wc = *pattern;
LAB_0067273f:
    if (__wc == L'\0') goto LAB_0067279b;
    if (__wc != L'*') {
      do {
        if (__wc == L'?') {
          if (*s == L'\0') goto LAB_006727dd;
        }
        else {
          if (__wc == L'\\') {
            wVar2 = pattern[1];
            if ((wVar2 == L'?') || (wVar2 == L'*')) {
              pattern = pattern + 1;
              __wc = wVar2;
            }
          }
          else if (__wc == L'*') goto LAB_0067273f;
          wVar4 = towupper(__wc);
          wVar5 = towupper(*s);
          if (wVar4 != wVar5) goto LAB_006727dd;
          if (*s == L'\0') goto LAB_006727b9;
        }
        s = s + 1;
        __wc = pattern[1];
        pattern = pattern + 1;
      } while( true );
    }
    do {
      pwVar1 = pattern + 1;
      pattern = pattern + 1;
    } while (*pwVar1 == L'*');
    if (*pwVar1 == L'\0') goto LAB_006727b9;
    if (*s == L'\0') {
LAB_006727dd:
      bVar3 = false;
    }
    else {
      while (bVar3 = ON_WildCardMatchNoCase(s,pattern), !bVar3) {
        pwVar1 = s + 1;
        s = s + 1;
        if (*pwVar1 == L'\0') {
          return bVar3;
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool ON_WildCardMatchNoCase(const wchar_t* s, const wchar_t* pattern)
{
  if ( !pattern || !pattern[0] ) {
    return ( !s || !s[0] ) ? true : false;
  }

  if ( *pattern == '*' )
  {
    pattern++;
    while ( *pattern == '*' )
      pattern++;

    if ( !pattern[0] )
      return true;

    while (*s) {
      if ( ON_WildCardMatchNoCase(s,pattern) )
        return true;
      s++;
    }

    return false;
  }

  while ( *pattern != '*' )
  {
    if ( *pattern == '?' )
    {
      if ( *s) {
        pattern++;
        s++;
        continue;
      }
      return false;
    }

    if ( *pattern == '\\' )
    {
      switch( pattern[1] )
      {
      case '*':
      case '?':
        pattern++;
        break;
      }
    }
    if ( towupper(*pattern) != towupper(*s) )
    {
      return false;
    }

    if ( *s == 0 )
      return true;

    pattern++;
    s++;
  }

  return ON_WildCardMatchNoCase(s,pattern);
}